

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O0

int SetIC(N_Vector y,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long *in_RSI;
  undefined8 in_RDI;
  double dVar6;
  sunindextype i;
  sunrealtype p;
  sunrealtype x;
  sunrealtype *data;
  sunrealtype dx;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  UserData udata;
  long local_58;
  
  lVar4 = *in_RSI;
  dVar1 = (double)in_RSI[2];
  dVar2 = (double)in_RSI[3];
  dVar3 = (double)in_RSI[1];
  lVar5 = N_VGetArrayPointer(in_RDI);
  for (local_58 = 0; local_58 < lVar4; local_58 = local_58 + 1) {
    dVar6 = exp(-(((double)local_58 * dVar3 - 0.5) * ((double)local_58 * dVar3 - 0.5)) / 0.1);
    dVar6 = dVar6 * 0.1;
    *(double *)(lVar5 + local_58 * 0x18) = dVar1 + dVar6;
    *(double *)(lVar5 + 8 + local_58 * 0x18) = dVar2 / dVar1 + dVar6;
    *(double *)(lVar5 + 0x10 + local_58 * 0x18) = dVar2 + dVar6;
  }
  return 0;
}

Assistant:

static int SetIC(N_Vector y, void* user_data)
{
  UserData udata    = (UserData)user_data; /* access problem data    */
  sunindextype N    = udata->N;            /* set variable shortcuts */
  sunrealtype a     = udata->a;
  sunrealtype b     = udata->b;
  sunrealtype dx    = udata->dx;
  sunrealtype* data = NULL;

  sunrealtype x, p;
  sunindextype i;

  /* Access data array from NVector y */
  data = N_VGetArrayPointer(y);

  /* Set initial conditions into y */
  for (i = 0; i < N; i++)
  {
    x = i * dx;
    p = SUN_RCONST(0.1) *
        SUNRexp(-(SUNSQR(x - SUN_RCONST(0.5))) / SUN_RCONST(0.1));
    data[IDX(i, 0)] = a + p;
    data[IDX(i, 1)] = b / a + p;
    data[IDX(i, 2)] = b + p;
  }

  /* return success */
  return (0);
}